

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

int key_type_s_internal(BinarySource *src)

{
  _Bool _Var1;
  ssh_keyalg *psVar2;
  ptrlen realsig;
  ptrlen realsig_00;
  ptrlen realsig_01;
  ptrlen realsig_02;
  ptrlen realsig_03;
  ptrlen pVar3;
  size_t local_b0;
  size_t local_a0;
  size_t local_90;
  size_t local_70;
  size_t local_60;
  size_t local_50;
  size_t local_40;
  size_t local_30;
  size_t local_20;
  BinarySource *src_local;
  
  BinarySource_REWIND_TO__(src->binarysource_,0);
  pVar3.len = 0x21;
  pVar3.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  _Var1 = expect_signature(src,pVar3);
  if (_Var1) {
    src_local._4_4_ = 2;
  }
  else {
    BinarySource_REWIND_TO__(src->binarysource_,0);
    realsig.len = 0x1a;
    realsig.ptr = "---- BEGIN SSH2 PUBLIC KEY";
    _Var1 = expect_signature(src,realsig);
    if (_Var1) {
      src_local._4_4_ = 9;
    }
    else {
      BinarySource_REWIND_TO__(src->binarysource_,0);
      realsig_00.len = 0x14;
      realsig_00.ptr = "PuTTY-User-Key-File-";
      _Var1 = expect_signature(src,realsig_00);
      if (_Var1) {
        src_local._4_4_ = 3;
      }
      else {
        BinarySource_REWIND_TO__(src->binarysource_,0);
        realsig_01.len = 0x1e;
        realsig_01.ptr = "-----BEGIN OPENSSH PRIVATE KEY";
        _Var1 = expect_signature(src,realsig_01);
        if (_Var1) {
          src_local._4_4_ = 6;
        }
        else {
          BinarySource_REWIND_TO__(src->binarysource_,0);
          realsig_02.len = 0xb;
          realsig_02.ptr = "-----BEGIN ";
          _Var1 = expect_signature(src,realsig_02);
          if (_Var1) {
            src_local._4_4_ = 5;
          }
          else {
            BinarySource_REWIND_TO__(src->binarysource_,0);
            realsig_03.len = 0x20;
            realsig_03.ptr = "---- BEGIN SSH2 ENCRYPTED PRIVAT";
            _Var1 = expect_signature(src,realsig_03);
            if (_Var1) {
              src_local._4_4_ = 7;
            }
            else {
              BinarySource_REWIND_TO__(src->binarysource_,0);
              pVar3 = BinarySource_get_chars(src->binarysource_,"0123456789");
              local_20 = pVar3.len;
              if (local_20 != 0) {
                pVar3 = BinarySource_get_chars(src->binarysource_," ");
                local_30 = pVar3.len;
                if (local_30 == 1) {
                  pVar3 = BinarySource_get_chars(src->binarysource_,"0123456789");
                  local_40 = pVar3.len;
                  if (local_40 != 0) {
                    pVar3 = BinarySource_get_chars(src->binarysource_," ");
                    local_50 = pVar3.len;
                    if (local_50 == 1) {
                      pVar3 = BinarySource_get_chars(src->binarysource_,"0123456789");
                      local_60 = pVar3.len;
                      if (local_60 != 0) {
                        pVar3 = BinarySource_get_nonchars(src->binarysource_," \n");
                        local_70 = pVar3.len;
                        if (local_70 == 0) {
                          return 8;
                        }
                      }
                    }
                  }
                }
              }
              BinarySource_REWIND_TO__(src->binarysource_,0);
              pVar3 = BinarySource_get_nonchars(src->binarysource_," \n");
              psVar2 = find_pubkey_alg_len(pVar3);
              if (psVar2 != (ssh_keyalg *)0x0) {
                pVar3 = BinarySource_get_chars(src->binarysource_," ");
                local_90 = pVar3.len;
                if (local_90 == 1) {
                  pVar3 = BinarySource_get_chars
                                    (src->binarysource_,
                                     "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz+/="
                                    );
                  local_a0 = pVar3.len;
                  if (local_a0 != 0) {
                    pVar3 = BinarySource_get_nonchars(src->binarysource_," \n");
                    local_b0 = pVar3.len;
                    if (local_b0 == 0) {
                      return 10;
                    }
                  }
                }
              }
              src_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return src_local._4_4_;
}

Assistant:

static int key_type_s_internal(BinarySource *src)
{
    static const ptrlen public_std_sig =
        PTRLEN_DECL_LITERAL("---- BEGIN SSH2 PUBLIC KEY");
    static const ptrlen putty2_sig =
        PTRLEN_DECL_LITERAL("PuTTY-User-Key-File-");
    static const ptrlen sshcom_sig =
        PTRLEN_DECL_LITERAL("---- BEGIN SSH2 ENCRYPTED PRIVAT");
    static const ptrlen openssh_new_sig =
        PTRLEN_DECL_LITERAL("-----BEGIN OPENSSH PRIVATE KEY");
    static const ptrlen openssh_sig =
        PTRLEN_DECL_LITERAL("-----BEGIN ");

    if (BinarySource_REWIND(src), expect_signature(src, rsa1_signature))
        return SSH_KEYTYPE_SSH1;
    if (BinarySource_REWIND(src), expect_signature(src, public_std_sig))
        return SSH_KEYTYPE_SSH2_PUBLIC_RFC4716;
    if (BinarySource_REWIND(src), expect_signature(src, putty2_sig))
        return SSH_KEYTYPE_SSH2;
    if (BinarySource_REWIND(src), expect_signature(src, openssh_new_sig))
        return SSH_KEYTYPE_OPENSSH_NEW;
    if (BinarySource_REWIND(src), expect_signature(src, openssh_sig))
        return SSH_KEYTYPE_OPENSSH_PEM;
    if (BinarySource_REWIND(src), expect_signature(src, sshcom_sig))
        return SSH_KEYTYPE_SSHCOM;

    BinarySource_REWIND(src);
    if (get_chars(src, "0123456789").len > 0 && get_chars(src, " ").len == 1 &&
        get_chars(src, "0123456789").len > 0 && get_chars(src, " ").len == 1 &&
        get_chars(src, "0123456789").len > 0 &&
        get_nonchars(src, " \n").len == 0)
        return SSH_KEYTYPE_SSH1_PUBLIC;

    BinarySource_REWIND(src);
    if (find_pubkey_alg_len(get_nonchars(src, " \n")) > 0 &&
        get_chars(src, " ").len == 1 &&
        get_chars(src, "0123456789ABCDEFGHIJKLMNOPQRSTUV"
                   "WXYZabcdefghijklmnopqrstuvwxyz+/=").len > 0 &&
        get_nonchars(src, " \n").len == 0)
        return SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH;

    return SSH_KEYTYPE_UNKNOWN;        /* unrecognised or EOF */
}